

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_atof.h
# Opt level: O2

uint64_t Assimp::strtoul10_64(char *in,char **out,uint *max_inout)

{
  char *pcVar1;
  ulong uVar2;
  Logger *this;
  invalid_argument *this_00;
  long lVar3;
  char *pcVar4;
  char cVar5;
  ulong uVar6;
  long lVar7;
  allocator local_1e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0 [11];
  
  cVar5 = *in;
  if ((byte)(cVar5 - 0x3aU) < 0xf6) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string((string *)&local_1c0,"The string \"",&local_1e1);
    std::operator+(&local_1e0,&local_1c0,in);
    std::operator+(local_1a0,&local_1e0,"\" cannot be converted into a value.");
    std::invalid_argument::invalid_argument(this_00,(string *)local_1a0);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  lVar3 = 1;
  lVar7 = 0;
  uVar6 = 0;
  while( true ) {
    if ((byte)(cVar5 - 0x3aU) < 0xf6) {
      if (out != (char **)0x0) {
        *out = in + -lVar7;
      }
      if (max_inout != (uint *)0x0) {
        *max_inout = -(int)lVar7;
      }
      return uVar6;
    }
    uVar2 = (ulong)(byte)(cVar5 - 0x30) + uVar6 * 10;
    if (uVar2 < uVar6) break;
    if ((max_inout != (uint *)0x0) && ((uint)lVar3 == *max_inout)) {
      if (out == (char **)0x0) {
        return uVar2;
      }
      pcVar4 = in + -lVar7;
      do {
        pcVar1 = pcVar4 + 1;
        pcVar4 = pcVar4 + 1;
      } while ((byte)(*pcVar1 - 0x30U) < 10);
      *out = pcVar4;
      return uVar2;
    }
    cVar5 = in[lVar3];
    lVar7 = lVar7 + -1;
    lVar3 = lVar3 + 1;
    uVar6 = uVar2;
  }
  this = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[24]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
             (char (*) [24])"Converting the string \"");
  std::operator<<((ostream *)local_1a0,in + -lVar7);
  std::operator<<((ostream *)local_1a0,"\" into a value resulted in overflow.");
  std::__cxx11::stringbuf::str();
  Logger::warn(this,local_1e0._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  return 0;
}

Assistant:

inline
uint64_t strtoul10_64( const char* in, const char** out=0, unsigned int* max_inout=0) {
    unsigned int cur = 0;
    uint64_t value = 0;

    if ( *in < '0' || *in > '9' ) {
        throw std::invalid_argument( std::string( "The string \"" ) + in + "\" cannot be converted into a value." );
    }

    for ( ;; ) {
        if ( *in < '0' || *in > '9' ) {
            break;
        }

        const uint64_t new_value = ( value * (uint64_t) 10 ) + ( (uint64_t) ( *in - '0' ) );

        // numeric overflow, we rely on you
        if ( new_value < value ) {
            ASSIMP_LOG_WARN_F( "Converting the string \"", in, "\" into a value resulted in overflow." );
            return 0;
        }

        value = new_value;

        ++in;
        ++cur;

        if (max_inout && *max_inout == cur) {
            if (out) { /* skip to end */
                while ( *in >= '0' && *in <= '9' ) {
                    ++in;
                }
                *out = in;
            }

            return value;
        }
    }
    if ( out ) {
        *out = in;
    }

    if ( max_inout ) {
        *max_inout = cur;
    }

    return value;
}